

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_UnknownFieldPartialEqualTest_Test::TestBody
          (MessageDifferencerTest_UnknownFieldPartialEqualTest_Test *this)

{
  int iVar1;
  string *psVar2;
  UnknownFieldSet *pUVar3;
  UnknownField *pUVar4;
  Nonnull<const_char_*> pcVar5;
  SooRep *this_00;
  char *in_R9;
  SooRep *this_01;
  TestEmptyMessage empty2;
  TestEmptyMessage empty1;
  MessageDifferencer differencer;
  AssertHelper local_230;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_228;
  internal local_220 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  ZeroFieldsBase local_210;
  ZeroFieldsBase local_1f8;
  string local_1e0;
  MessageDifferencer local_1c0;
  
  proto2_unittest::TestEmptyMessage::TestEmptyMessage((TestEmptyMessage *)&local_1f8,(Arena *)0x0);
  proto2_unittest::TestEmptyMessage::TestEmptyMessage((TestEmptyMessage *)&local_210,(Arena *)0x0);
  if ((local_1f8.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) == 0) {
    this_01 = (SooRep *)
              protobuf::internal::InternalMetadata::
              mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                        (&local_1f8.super_Message.super_MessageLite._internal_metadata_);
  }
  else {
    this_01 = (SooRep *)
              ((local_1f8.super_Message.super_MessageLite._internal_metadata_.ptr_ &
               0xfffffffffffffffeU) + 8);
  }
  if ((local_210.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) == 0) {
    this_00 = (SooRep *)
              protobuf::internal::InternalMetadata::
              mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                        (&local_210.super_Message.super_MessageLite._internal_metadata_);
  }
  else {
    this_00 = (SooRep *)
              ((local_210.super_Message.super_MessageLite._internal_metadata_.ptr_ &
               0xfffffffffffffffeU) + 8);
  }
  UnknownFieldSet::AddVarint((UnknownFieldSet *)this_01,0xf3,0x7a);
  psVar2 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_((UnknownFieldSet *)this_01,0xf5);
  std::__cxx11::string::_M_replace((ulong)psVar2,0,(char *)psVar2->_M_string_length,0x10e647b);
  pUVar3 = UnknownFieldSet::AddGroup((UnknownFieldSet *)this_01,0xf6);
  UnknownFieldSet::AddFixed32(pUVar3,0xf8,1);
  iVar1 = protobuf::internal::SooRep::size
                    (this_01,(undefined1  [16])
                             ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
  if (2 < iVar1) {
    pUVar4 = RepeatedField<google::protobuf::UnknownField>::elements
                       ((RepeatedField<google::protobuf::UnknownField> *)this_01,
                        (undefined1  [16])
                        ((undefined1  [16])this_01->field_0 & (undefined1  [16])0x4) ==
                        (undefined1  [16])0x0);
    if (pUVar4[2].type_ == 4) {
      UnknownFieldSet::AddFixed32(pUVar4[2].data_.group,0xf8,2);
      UnknownFieldSet::AddVarint((UnknownFieldSet *)this_00,0xf3,0x7a);
      psVar2 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_((UnknownFieldSet *)this_00,0xf5);
      std::__cxx11::string::_M_replace((ulong)psVar2,0,(char *)psVar2->_M_string_length,0x10e647b);
      pUVar3 = UnknownFieldSet::AddGroup((UnknownFieldSet *)this_00,0xf6);
      UnknownFieldSet::AddFixed32(pUVar3,0xf8,1);
      iVar1 = protobuf::internal::SooRep::size
                        (this_00,(undefined1  [16])
                                 ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                                 (undefined1  [16])0x0);
      if (iVar1 < 3) {
        pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (2,(long)iVar1,"index < size()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                   ,0x349,pcVar5);
        goto LAB_00b79fb7;
      }
      pUVar4 = RepeatedField<google::protobuf::UnknownField>::elements
                         ((RepeatedField<google::protobuf::UnknownField> *)this_00,
                          (undefined1  [16])
                          ((undefined1  [16])this_00->field_0 & (undefined1  [16])0x4) ==
                          (undefined1  [16])0x0);
      if (pUVar4[2].type_ == 4) {
        UnknownFieldSet::AddFixed32(pUVar4[2].data_.group,0xf8,2);
        util::MessageDifferencer::MessageDifferencer(&local_1c0);
        util::MessageDifferencer::set_scope(&local_1c0,PARTIAL);
        local_220[0] = (internal)
                       util::MessageDifferencer::Compare
                                 (&local_1c0,&local_1f8.super_Message,&local_210.super_Message);
        local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_220[0]) {
          testing::Message::Message((Message *)&local_228);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_1e0,local_220,(AssertionResult *)"differencer.Compare(empty1, empty2)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_230,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                     ,0x4da,local_1e0._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_228);
          testing::internal::AssertHelper::~AssertHelper(&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
          }
          if (local_228._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_228._M_head_impl + 8))();
          }
          if (local_218 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_218,local_218);
          }
        }
        util::MessageDifferencer::~MessageDifferencer(&local_1c0);
        protobuf::internal::ZeroFieldsBase::~ZeroFieldsBase(&local_210);
        protobuf::internal::ZeroFieldsBase::~ZeroFieldsBase(&local_1f8);
        return;
      }
    }
    __assert_fail("type() == TYPE_GROUP",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set.h"
                  ,0x192,"UnknownFieldSet *google::protobuf::UnknownField::mutable_group()");
  }
  pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                     (2,(long)iVar1,"index < size()");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x349,pcVar5);
LAB_00b79fb7:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c0)
  ;
}

Assistant:

TEST(MessageDifferencerTest, UnknownFieldPartialEqualTest) {
  unittest::TestEmptyMessage empty1;
  unittest::TestEmptyMessage empty2;

  UnknownFieldSet* unknown1 = empty1.mutable_unknown_fields();
  UnknownFieldSet* unknown2 = empty2.mutable_unknown_fields();

  unknown1->AddVarint(243, 122);
  unknown1->AddLengthDelimited(245, "abc");
  unknown1->AddGroup(246)->AddFixed32(248, 1);
  unknown1->mutable_field(2)->mutable_group()->AddFixed32(248, 2);

  unknown2->AddVarint(243, 122);
  unknown2->AddLengthDelimited(245, "abc");
  unknown2->AddGroup(246)->AddFixed32(248, 1);
  unknown2->mutable_field(2)->mutable_group()->AddFixed32(248, 2);

  util::MessageDifferencer differencer;
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.Compare(empty1, empty2));
}